

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O0

int rfc5444_reader_handle_packet(rfc5444_reader *parser,uint8_t *buffer,size_t length)

{
  byte bVar1;
  uint8_t uVar2;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  rfc5444_result result;
  uint8_t first_byte;
  _Bool has_tlv;
  uint8_t *eob;
  uint8_t *ptr;
  rfc5444_reader_tlvblock_consumer *last_started;
  rfc5444_reader_tlvblock_consumer *consumer;
  avl_tree entries;
  rfc5444_reader_tlvblock_context context;
  size_t length_local;
  uint8_t *buffer_local;
  rfc5444_reader *parser_local;
  
  __tempptr._0_4_ = RFC5444_OKAY;
  if (length < 0x10000) {
    _result = buffer + length;
    eob = buffer;
    memset(&entries.comp,0,0x98);
    entries.comp = (_func_int_void_ptr_void_ptr *)parser;
    __tempptr._6_1_ = _rfc5444_get_u8(&eob,_result,(rfc5444_result *)&__tempptr);
    uVar2 = rfc5444_get_pktversion(__tempptr._6_1_);
    bVar1 = __tempptr._6_1_;
    if (uVar2 == '\0') {
      if ((__tempptr._6_1_ & 8) != 0) {
        _rfc5444_get_u16(&eob,_result,(rfc5444_result *)&__tempptr);
      }
      if ((rfc5444_result)__tempptr == RFC5444_OKAY) {
        avl_init((avl_tree *)&consumer,avl_comp_uint32,true);
        ptr = (uint8_t *)0x0;
        __tempptr._7_1_ = (bVar1 & 4) != 0;
        if ((!(bool)__tempptr._7_1_) ||
           (__tempptr._0_4_ = _parse_tlvblock(parser,(avl_tree *)&consumer,&eob,_result,'\0'),
           parser_local._4_4_ = (rfc5444_result)__tempptr, (rfc5444_result)__tempptr == RFC5444_OKAY
           )) {
          last_started = (rfc5444_reader_tlvblock_consumer *)
                         (parser->packet_consumer).list_head.next;
          while ((last_started->_node).list.prev != (parser->packet_consumer).list_head.prev) {
            ptr = (uint8_t *)last_started;
            if (((last_started->start_callback !=
                  (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) &&
                (__tempptr._0_4_ =
                      (*last_started->start_callback)
                                ((rfc5444_reader_tlvblock_context *)&entries.comp),
                (rfc5444_result)__tempptr != RFC5444_OKAY)) ||
               (((__tempptr._7_1_ & 1) != 0 &&
                (((last_started->tlv_callback !=
                   (_func_rfc5444_result_rfc5444_reader_tlvblock_entry_ptr_rfc5444_reader_tlvblock_context_ptr
                    *)0x0 ||
                  (last_started->block_callback !=
                   (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0)) &&
                 (__tempptr._0_4_ =
                       _schedule_tlvblock(last_started,
                                          (rfc5444_reader_tlvblock_context *)&entries.comp,
                                          (avl_tree *)&consumer,'\0'),
                 (rfc5444_result)__tempptr != RFC5444_OKAY)))))) goto LAB_00154b12;
            last_started = (rfc5444_reader_tlvblock_consumer *)(last_started->_node).list.next;
          }
          while ((rfc5444_result)__tempptr == RFC5444_OKAY && eob < _result) {
            __tempptr._0_4_ =
                 _handle_message(parser,(rfc5444_reader_tlvblock_context *)&entries.comp,&eob,
                                 _result);
          }
LAB_00154b12:
          if ((parser->packet_consumer).count != 0) {
            last_started = (rfc5444_reader_tlvblock_consumer *)ptr;
            while ((last_started->_node).list.next != (parser->packet_consumer).list_head.next) {
              if (last_started->end_callback !=
                  (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) {
                (*last_started->end_callback)
                          ((rfc5444_reader_tlvblock_context *)&entries.comp,
                           (rfc5444_result)__tempptr != RFC5444_OKAY);
              }
              last_started = (rfc5444_reader_tlvblock_consumer *)(last_started->_node).list.prev;
            }
          }
          _free_tlvblock(parser,(avl_tree *)&consumer);
          if ((rfc5444_result)__tempptr == RFC5444_DROP_PACKET) {
            parser_local._4_4_ = RFC5444_OKAY;
          }
          else {
            parser_local._4_4_ = (rfc5444_result)__tempptr;
          }
        }
      }
      else {
        parser_local._4_4_ = (rfc5444_result)__tempptr;
      }
    }
    else {
      parser_local._4_4_ = RFC5444_UNSUPPORTED_VERSION;
    }
  }
  else {
    parser_local._4_4_ = RFC5444_TOO_LARGE;
  }
  return parser_local._4_4_;
}

Assistant:

enum rfc5444_result
rfc5444_reader_handle_packet(struct rfc5444_reader *parser, const uint8_t *buffer, size_t length)
{
  struct rfc5444_reader_tlvblock_context context;
  struct avl_tree entries;
  struct rfc5444_reader_tlvblock_consumer *consumer, *last_started;
  const uint8_t *ptr, *eob;
  bool has_tlv;
  uint8_t first_byte;
  enum rfc5444_result result = RFC5444_OKAY;

  if (length > 65535) {
    return RFC5444_TOO_LARGE;
  }

  /* copy pointer to prevent writing over parameter */
  ptr = buffer;
  eob = buffer + length;

  /* initialize tlv context */
  memset(&context, 0, sizeof(context));
  context.type = RFC5444_CONTEXT_PACKET;
  context.reader = parser;

  /* read header of packet */
  first_byte = _rfc5444_get_u8(&ptr, eob, &result);
  context.pkt_version = rfc5444_get_pktversion(first_byte);
  context.pkt_flags = first_byte & RFC5444_PKT_FLAGMASK;

  if (context.pkt_version != 0) {
    /*
     * bad packet version, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return RFC5444_UNSUPPORTED_VERSION;
  }

  /* check for sequence number */
  context.has_pktseqno = ((context.pkt_flags & RFC5444_PKT_FLAG_SEQNO) != 0);
  if (context.has_pktseqno) {
    context.pkt_seqno = _rfc5444_get_u16(&ptr, eob, &result);
  }

  if (result != RFC5444_OKAY) {
    /*
     * error during parsing, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return result;
  }

  /* initialize avl_tree */
  avl_init(&entries, avl_comp_uint32, true);
  last_started = NULL;

  /* check for packet tlv */
  has_tlv = (context.pkt_flags & RFC5444_PKT_FLAG_TLV) != 0;
  if (has_tlv) {
    result = _parse_tlvblock(parser, &entries, &ptr, eob, 0);
    if (result != RFC5444_OKAY) {
      /*
       * error while parsing TLV block, do not jump to cleanup_parse packet because
       * we have not allocated any resources at this point
       */
      return result;
    }
  }

  /* update packet buffer pointer */
  context.pkt_buffer = buffer;
  context.pkt_size = length;

  /* handle packet consumers, call start callbacks */
  avl_for_each_element(&parser->packet_consumer, consumer, _node) {
    last_started = consumer;
    /* this one can drop a packet */
    if (consumer->start_callback != NULL) {
      context.consumer = consumer;
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        consumer->start_callback(&context);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
    /* handle packet tlv consumers */
    if (has_tlv && (consumer->tlv_callback != NULL || consumer->block_callback != NULL)) {
      /* can drop packet */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        _schedule_tlvblock(consumer, &context, &entries, 0);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
  }

  /* parse messages */
  while (result == RFC5444_OKAY && ptr < eob) {
    /* can drop packet (need to be there for error handling too) */
    result = _handle_message(parser, &context, &ptr, eob);
  }

#if DISALLOW_CONSUMER_CONTEXT_DROP == false
cleanup_parse_packet:
#endif
  /* call end-of-context callback */
  if (!avl_is_empty(&parser->packet_consumer)) {
    avl_for_first_to_element_reverse(&parser->packet_consumer, last_started, consumer, _node) {
      if (consumer->end_callback) {
        context.consumer = consumer;
        consumer->end_callback(&context, result != RFC5444_OKAY);
      }
    }
  }
  _free_tlvblock(parser, &entries);

  /* do not tell caller about packet drop */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
  if (result == RFC5444_DROP_PACKET) {
    return RFC5444_OKAY;
  }
#endif
  return result;
}